

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

bool __thiscall tsip::is_report_found(tsip *this,_command_packet *_cmd)

{
  UINT8 UVar1;
  bool isfound;
  _command_packet *_cmd_local;
  tsip *this_local;
  
  isfound = false;
  UVar1 = (_cmd->raw).data[0];
  if (UVar1 == '\x1e') {
    isfound = (short)(*(short *)&this->m_updated << 0xc) < 0;
  }
  else if (UVar1 == '\x1f') {
    isfound = (short)(*(short *)&this->m_updated << 0xc) < 0;
  }
  else if (UVar1 == '%') {
    isfound = (short)(*(short *)&this->m_updated << 0xc) < 0;
  }
  else if (UVar1 == '5') {
    isfound = (short)(*(short *)&this->m_updated << 9) < 0;
  }
  else if (UVar1 == '7') {
    if (((short)(*(short *)&this->m_updated << 0xf) < 0) &&
       ((short)(*(short *)&this->m_updated << 0xe) < 0)) {
      isfound = true;
    }
  }
  else if (UVar1 == 0x8e) {
    UVar1 = (_cmd->raw).data[1];
    if (UVar1 == 0xa2) {
      isfound = (short)(*(short *)&this->m_updated << 5) < 0;
    }
    else if (UVar1 == 0xab) {
      isfound = (short)(*(short *)&this->m_updated << 7) < 0;
    }
    else if (UVar1 == 0xac) {
      isfound = (short)(*(short *)&this->m_updated << 6) < 0;
    }
  }
  else {
    isfound = false;
  }
  return isfound;
}

Assistant:

bool tsip::is_report_found(_command_packet &_cmd) {
	bool isfound = false;

	switch (_cmd.report.code){

		// 0x1e
		case COMMAND_COLD_FACTORY_RESET :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x1f
		case COMMAND_REQUEST_SW_VERSION :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x25
		case COMMAND_WARM_RESET_SELF_TEST :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x35
		case COMMAND_SET_IO_OPTIONS :
			// 0x55	 REPORT_IO_OPTIONS
			if (m_updated.report.io_options) {
				isfound = true;
			}
			break;

		// 0x37
		case COMMAND_REQUEST_POSITION :
			// 0x42 REPORT_ECEF_POSITION_S
			if (m_updated.report.ecef_position_s && m_updated.report.ecef_position_d) {
				isfound = true;
			}
			// 0x43 REPORT_ECEF_VELOCITY

			// 0x83 REPORT_ECEF_POSITION_D
			//if (m_updated.report.ecef_position_d) {
			//	isfound = true;
			//}
			break;
		//0x8E
		case COMMAND_SUPER_PACKET:
			switch (_cmd.extended.subcode) {
				// 0xa2
				case REPORT_SUPER_UTC_GPS_TIME :
					if (m_updated.report.utc_gps_time) {
						isfound = true;
					}
					break;
				// 0xab
				case REPORT_SUPER_PRIMARY_TIME :
					if (m_updated.report.primary_time) {
						isfound = true;
					}
					break;
				// 0xac
				case REPORT_SUPER_SECONDARY_TIME :
					if (m_updated.report.secondary_time) {
						isfound = true;
					}
					break;
			}
			break;
		default :
			isfound = false;
		}
	return isfound;
}